

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::flip41(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  tetgenmesh *ptVar1;
  tetgenmesh *p2;
  tetgenmesh *p3;
  double *pdVar2;
  tetrahedron ppdVar3;
  memorypool *pmVar4;
  tetgenmesh *ptVar5;
  tetgenmesh *ptVar6;
  undefined8 *puVar7;
  tetgenio *ptVar8;
  int (*paiVar9) [12];
  int i;
  long lVar10;
  uint *puVar11;
  tetrahedron ppdVar12;
  long lVar13;
  ulong *puVar14;
  void *pvVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int *piVar19;
  tetgenmesh *p2_00;
  tetgenmesh *ptVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  shellface *pppdVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  tetrahedron *pppdVar29;
  triface topcastets [3];
  face flipshs [4];
  triface local_110;
  tetgenmesh *local_100;
  tetgenmesh *local_f8;
  uint local_ec;
  tetgenmesh *local_e8;
  tetrahedron *local_e0;
  double local_d8;
  ulong local_d0;
  ulong local_c8;
  triface *local_c0;
  ulong uStack_b8;
  ulong local_b0 [6];
  double local_80;
  face local_78 [3];
  ulong local_48;
  uint local_40;
  
  local_d8 = (double)CONCAT44(local_d8._4_4_,hullflag);
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&local_c0 + lVar10) = 0;
    *(undefined4 *)((long)local_b0 + lVar10 + -8) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  local_110.tet = (tetrahedron *)0x0;
  local_110.ver = 0;
  lVar10 = 0;
  do {
    *(undefined8 *)((long)&local_78[0].sh + lVar10) = 0;
    *(undefined4 *)((long)&local_78[0].shver + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  local_e0 = fliptets->tet;
  pppdVar29 = fliptets[3].tet;
  uVar21 = fliptets[3].ver;
  ptVar1 = (tetgenmesh *)pppdVar29[orgpivot[(int)uVar21]];
  local_e8 = (tetgenmesh *)pppdVar29[destpivot[(int)uVar21]];
  p2 = (tetgenmesh *)pppdVar29[apexpivot[(int)uVar21]];
  p3 = (tetgenmesh *)local_e0[destpivot[fliptets->ver]];
  local_f8 = (tetgenmesh *)local_e0[orgpivot[fliptets->ver]];
  this->flip41count = this->flip41count + 1;
  lVar10 = 8;
  do {
    iVar16 = enexttbl[*(int *)((long)&fliptets->tet + lVar10)];
    uVar17 = *(ulong *)(*(long *)((long)fliptets + lVar10 + -8) + (long)facepivot1[iVar16] * 8);
    *(ulong *)((long)&local_c0 + lVar10) = uVar17 & 0xfffffffffffffff0;
    *(int *)((long)local_b0 + lVar10 + -8) = enexttbl[facepivot2[iVar16][(uint)uVar17 & 0xf]];
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  ppdVar12 = pppdVar29[uVar21 & 3];
  local_d0 = (ulong)fsymtbl[(int)uVar21][(uint)ppdVar12 & 0xf];
  if (this->checksubfaceflag == 0) {
    local_ec = 0xffffffff;
  }
  else {
    uVar22 = 0;
    uVar17 = 0xffffffff;
    piVar19 = &local_78[0].shver;
    uVar23 = 0;
    do {
      local_110.tet =
           (tetrahedron *)((ulong)pppdVar29[facepivot1[(int)uVar21]] & 0xfffffffffffffff0);
      local_110.ver = facepivot2[(int)uVar21][(uint)pppdVar29[facepivot1[(int)uVar21]] & 0xf];
      if (local_110.tet[9] == (tetrahedron)0x0) {
        pppdVar24 = (shellface *)0x0;
      }
      else {
        pdVar2 = local_110.tet[9][local_110.ver & 3];
        pppdVar24 = (shellface *)((ulong)pdVar2 & 0xfffffffffffffff8);
        *piVar19 = tspivottbl[local_110.ver][(uint)pdVar2 & 7];
      }
      ((face *)(piVar19 + -2))->sh = pppdVar24;
      if (pppdVar24 != (shellface *)0x0) {
        uVar17 = uVar22 & 0xffffffff;
      }
      uVar23 = uVar23 + (pppdVar24 != (shellface *)0x0);
      uVar21 = enexttbl[(int)uVar21];
      fliptets[3].ver = uVar21;
      uVar22 = uVar22 + 1;
      piVar19 = piVar19 + 4;
    } while (uVar22 != 3);
    uVar21 = (uint)uVar17;
    local_ec = uVar21;
    if ((uVar23 != 0) && (local_ec = 3, uVar23 < 3)) {
      uVar17 = *(ulong *)(local_b0[(long)(int)uVar21 * 2 + -1] +
                         (ulong)((uint)local_b0[(long)(int)uVar21 * 2] & 3) * 8);
      local_110.tet = (tetrahedron *)(uVar17 & 0xfffffffffffffff0);
      piVar19 = fsymtbl[(int)(uint)local_b0[(long)(int)uVar21 * 2]] + ((uint)uVar17 & 0xf);
      ppdVar3 = local_110.tet[9];
      lVar10 = 8;
      do {
        iVar16 = *piVar19;
        local_110.ver = esymtbl[iVar16];
        if (ppdVar3 == (tetrahedron)0x0) {
          uVar17 = 0;
        }
        else {
          pdVar2 = ppdVar3[local_110.ver & 3];
          uVar17 = (ulong)pdVar2 & 0xfffffffffffffff8;
          *(int *)((long)&local_78[0].sh + lVar10) = tspivottbl[local_110.ver][(uint)pdVar2 & 7];
        }
        *(ulong *)((long)&local_80 + lVar10) = uVar17;
        piVar19 = eprevtbl + iVar16;
        lVar10 = lVar10 + 0x10;
        local_ec = uVar21;
      } while (lVar10 != 0x38);
    }
  }
  fliptets->ver = 0xb;
  *(undefined4 *)((long)local_e0 + (long)this->elemmarkerindex * 4) = 0;
  if ((this->checksubsegflag != 0) && (ppdVar3 = local_e0[8], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = this->tet2segpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[8] = (tetrahedron)0x0;
  }
  if ((this->checksubfaceflag != 0) && (ppdVar3 = fliptets->tet[9], ppdVar3 != (tetrahedron)0x0)) {
    pmVar4 = this->tet2subpool;
    *ppdVar3 = (double *)pmVar4->deaditemstack;
    pmVar4->deaditemstack = ppdVar3;
    pmVar4->items = pmVar4->items + -1;
    fliptets->tet[9] = (tetrahedron)0x0;
  }
  local_c8 = (ulong)ppdVar12 & 0xfffffffffffffff0;
  lVar10 = 0x10;
  local_100 = ptVar1;
  do {
    ptVar20 = this;
    tetrahedrondealloc(this,*(tetrahedron **)((long)&fliptets->tet + lVar10));
    p2_00 = local_e8;
    ptVar6 = local_f8;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  ptVar5 = (tetgenmesh *)this->dummypoint;
  if (local_f8 != ptVar5) {
    *(uint *)((long)&local_f8->in + (long)this->pointmarkindex * 4 + 4) =
         (uint)*(byte *)((long)&local_f8->in + (long)this->pointmarkindex * 4 + 4);
    this->unuverts = this->unuverts + 1;
  }
  if (local_d8._0_4_ < 1) {
    uVar17 = (ulong)fliptets->ver;
    fliptets->tet[orgpivot[uVar17]] = (tetrahedron)ptVar1;
    fliptets->tet[destpivot[uVar17]] = (tetrahedron)local_e8;
    fliptets->tet[apexpivot[uVar17]] = (tetrahedron)p2;
    fliptets->tet[oppopivot[uVar17]] = (tetrahedron)p3;
    iVar16 = 0;
  }
  else {
    if (ptVar1 == ptVar5) {
      iVar16 = fliptets->ver;
      fliptets->tet[orgpivot[iVar16]] = (tetrahedron)p2;
      fliptets->tet[destpivot[iVar16]] = (tetrahedron)local_e8;
      fliptets->tet[apexpivot[iVar16]] = (tetrahedron)p3;
      fliptets->tet[oppopivot[iVar16]] = (tetrahedron)ptVar1;
      iVar16 = esymtbl[iVar16];
      fliptets->ver = iVar16;
      puVar11 = (uint *)(eprevtbl + iVar16);
      iVar16 = 1;
LAB_0011f6d0:
      uVar17 = (ulong)*puVar11;
      fliptets->ver = *puVar11;
    }
    else {
      if (local_e8 == ptVar5) {
        iVar16 = fliptets->ver;
        fliptets->tet[orgpivot[iVar16]] = (tetrahedron)ptVar1;
        fliptets->tet[destpivot[iVar16]] = (tetrahedron)p2;
        fliptets->tet[apexpivot[iVar16]] = (tetrahedron)p3;
        fliptets->tet[oppopivot[iVar16]] = (tetrahedron)local_e8;
        iVar16 = esymtbl[iVar16];
        fliptets->ver = iVar16;
        puVar11 = (uint *)(enexttbl + iVar16);
        iVar16 = 2;
        goto LAB_0011f6d0;
      }
      if (p2 == ptVar5) {
        iVar16 = fliptets->ver;
        fliptets->tet[orgpivot[iVar16]] = (tetrahedron)local_e8;
        fliptets->tet[destpivot[iVar16]] = (tetrahedron)ptVar1;
        fliptets->tet[apexpivot[iVar16]] = (tetrahedron)p3;
        fliptets->tet[oppopivot[iVar16]] = (tetrahedron)p2;
        puVar11 = (uint *)(esymtbl + iVar16);
        iVar16 = 3;
        ptVar20 = p2;
        goto LAB_0011f6d0;
      }
      uVar17 = (ulong)fliptets->ver;
      fliptets->tet[orgpivot[uVar17]] = (tetrahedron)ptVar1;
      fliptets->tet[destpivot[uVar17]] = (tetrahedron)local_e8;
      fliptets->tet[apexpivot[uVar17]] = (tetrahedron)p2;
      fliptets->tet[oppopivot[uVar17]] = (tetrahedron)p3;
      ptVar20 = p3;
      if (p3 != ptVar5) {
        iVar16 = 0;
        if (local_f8 == (tetgenmesh *)this->dummypoint) {
          this->hullsize = this->hullsize + -4;
          iVar16 = -1;
        }
        goto LAB_0011f6de;
      }
      iVar16 = 4;
    }
    this->hullsize = this->hullsize + -2;
  }
LAB_0011f6de:
  if (fc->remove_ndelaunay_edge != 0) {
    if (iVar16 < 1) {
      if (iVar16 < 0) {
        dVar26 = tetprismvol(ptVar20,(double *)ptVar1,(double *)local_e8,(double *)p2,(double *)p3);
        local_f8 = (tetgenmesh *)0x0;
        dVar28 = 0.0;
        pppdVar29 = (tetrahedron *)0x0;
        dVar27 = 0.0;
      }
      else {
        local_d8 = tetprismvol(ptVar20,(double *)local_f8,(double *)p3,(double *)ptVar1,
                               (double *)local_e8);
        local_e0 = (tetrahedron *)
                   tetprismvol(ptVar20,(double *)ptVar6,(double *)p3,(double *)p2_00,(double *)p2);
        local_80 = tetprismvol(ptVar20,(double *)ptVar6,(double *)p3,(double *)p2,
                               (double *)local_100);
        ptVar1 = local_100;
        local_f8 = (tetgenmesh *)
                   tetprismvol(ptVar20,(double *)local_100,(double *)p2_00,(double *)p2,
                               (double *)ptVar6);
        dVar26 = tetprismvol(ptVar20,(double *)ptVar1,(double *)p2_00,(double *)p2,(double *)p3);
        dVar27 = local_d8;
        dVar28 = local_80;
        pppdVar29 = local_e0;
      }
    }
    else {
      ptVar6 = (tetgenmesh *)this->dummypoint;
      if (ptVar1 == ptVar6) {
        pppdVar29 = (tetrahedron *)
                    tetprismvol(ptVar20,(double *)local_f8,(double *)p3,(double *)local_e8,
                                (double *)p2);
        local_f8 = (tetgenmesh *)0x0;
        dVar28 = 0.0;
LAB_0011f81d:
        dVar27 = 0.0;
      }
      else {
        if (local_e8 == ptVar6) {
          dVar28 = tetprismvol(ptVar20,(double *)local_f8,(double *)p3,(double *)p2,(double *)ptVar1
                              );
          local_f8 = (tetgenmesh *)0x0;
LAB_0011f819:
          pppdVar29 = (tetrahedron *)0x0;
          goto LAB_0011f81d;
        }
        if (p2 != ptVar6) {
          local_f8 = (tetgenmesh *)
                     tetprismvol(ptVar20,(double *)ptVar1,(double *)local_e8,(double *)p2,
                                 (double *)local_f8);
          dVar28 = 0.0;
          goto LAB_0011f819;
        }
        dVar27 = tetprismvol(ptVar20,(double *)local_f8,(double *)p3,(double *)ptVar1,
                             (double *)local_e8);
        local_f8 = (tetgenmesh *)0x0;
        dVar28 = 0.0;
        pppdVar29 = (tetrahedron *)0x0;
      }
      dVar26 = 0.0;
    }
    fc->tetprism_vol_sum =
         ((((dVar26 - dVar27) - (double)pppdVar29) - dVar28) - (double)local_f8) +
         fc->tetprism_vol_sum;
    uVar17 = (ulong)(uint)fliptets->ver;
  }
  lVar10 = 8;
  do {
    pppdVar29 = fliptets->tet;
    uVar25 = (ulong)esymtbl[(int)uVar17];
    uVar22 = *(ulong *)((long)&local_c0 + lVar10);
    uVar21 = *(uint *)((long)local_b0 + lVar10 + -8);
    pppdVar29[esymtbl[(int)uVar17] & 3] = (tetrahedron)((long)bondtbl[uVar25][(int)uVar21] | uVar22)
    ;
    *(ulong *)(uVar22 + (ulong)(uVar21 & 3) * 8) =
         (long)bondtbl[(int)uVar21][uVar25] | (ulong)pppdVar29;
    uVar21 = enexttbl[(int)uVar17];
    uVar17 = (ulong)uVar21;
    fliptets->ver = uVar21;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  fliptets->tet[uVar21 & 3] = (tetrahedron)((long)bondtbl[(int)uVar21][local_d0] | local_c8);
  local_f8 = (tetgenmesh *)(local_d0 * 3);
  paiVar9 = bondtbl + local_d0;
  local_d0 = (ulong)((uint)local_d0 & 3);
  *(ulong *)(local_c8 + local_d0 * 8) = (long)(*paiVar9)[(int)uVar21] | (ulong)fliptets->tet;
  if (this->checksubsegflag != 0) {
    lVar10 = 0;
    local_c0 = fliptets;
    do {
      pppdVar29 = (tetrahedron *)local_b0[lVar10 * 2 + -1];
      uVar25 = (ulong)(uint)eprevtbl[(int)local_b0[lVar10 * 2]];
      if ((pppdVar29[8] != (tetrahedron)0x0) &&
         (pdVar2 = pppdVar29[8][ver2edge[eprevtbl[(int)local_b0[lVar10 * 2]]]],
         pdVar2 != (double *)0x0)) {
        pppdVar29 = fliptets->tet;
        uVar21 = enexttbl[esymtbl[(int)uVar17]];
        uVar25 = (ulong)uVar21;
        ppdVar12 = pppdVar29[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar29[8] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar29[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = pppdVar29[8];
        }
        uVar17 = (ulong)pdVar2 & 0xfffffffffffffff8;
        ppdVar12[ver2edge[(int)uVar21]] = pdVar2;
        *(ulong *)(uVar17 + 0x48) = (long)(int)uVar21 | (ulong)pppdVar29;
        if ((fc->chkencflag & 1) != 0) {
          uVar21 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          fliptets = local_c0;
          if ((uVar21 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar21 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar4);
            *puVar14 = uVar17;
            *(uint *)(puVar14 + 1) = (uint)pdVar2 & 7;
            fliptets = local_c0;
          }
        }
      }
      uVar17 = (ulong)(uint)enexttbl[fliptets->ver];
      fliptets->ver = enexttbl[fliptets->ver];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    local_110.ver = (int)uVar25;
    lVar10 = 0;
    local_110.tet = pppdVar29;
    do {
      iVar16 = (int)uVar17;
      if ((*(long *)(local_b0[lVar10 * 2 + -1] + 0x40) != 0) &&
         (pdVar2 = *(double **)
                    (*(long *)(local_b0[lVar10 * 2 + -1] + 0x40) +
                    (long)ver2edge[(int)local_b0[lVar10 * 2]] * 8), pdVar2 != (double *)0x0)) {
        ppdVar12 = fliptets->tet[8];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets->tet[8] = ppdVar12;
          lVar13 = 0;
          do {
            fliptets->tet[8][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          ppdVar12 = fliptets->tet[8];
          iVar16 = fliptets->ver;
        }
        ppdVar12[ver2edge[iVar16]] = pdVar2;
        uVar17 = (ulong)pdVar2 & 0xfffffffffffffff8;
        *(ulong *)(uVar17 + 0x48) = (long)iVar16 | (ulong)fliptets->tet;
        if ((fc->chkencflag & 1) != 0) {
          uVar21 = *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4);
          if ((uVar21 & 4) == 0) {
            pmVar4 = this->badsubsegs;
            *(uint *)(uVar17 + 4 + (long)this->shmarkindex * 4) = uVar21 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar4);
            *puVar14 = uVar17;
            *(uint *)(puVar14 + 1) = (uint)pdVar2 & 7;
            iVar16 = fliptets->ver;
          }
        }
      }
      uVar17 = (ulong)(uint)enexttbl[iVar16];
      fliptets->ver = enexttbl[iVar16];
      lVar10 = lVar10 + 1;
      p2_00 = local_e8;
    } while (lVar10 != 3);
  }
  if (this->checksubfaceflag == 0) goto LAB_0012010e;
  lVar10 = 0;
  do {
    if (*(long *)(local_b0[lVar10 * 2 + -1] + 0x48) != 0) {
      uVar22 = *(ulong *)(*(long *)(local_b0[lVar10 * 2 + -1] + 0x48) +
                         (ulong)((uint)local_b0[lVar10 * 2] & 3) * 8);
      if (uVar22 != 0) {
        iVar16 = tspivottbl[(int)(uint)local_b0[lVar10 * 2]][(uint)uVar22 & 7];
        pppdVar29 = fliptets->tet;
        uVar21 = esymtbl[(int)uVar17];
        uVar25 = (ulong)uVar21;
        ppdVar12 = pppdVar29[9];
        if (ppdVar12 == (tetrahedron)0x0) {
          ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
          pppdVar29[9] = ppdVar12;
          lVar13 = 0;
          do {
            pppdVar29[9][lVar13] = (double *)0x0;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          ppdVar12 = pppdVar29[9];
        }
        uVar22 = uVar22 & 0xfffffffffffffff8;
        uVar17 = (long)iVar16 ^ 1;
        ppdVar12[uVar21 & 3] = (double *)((long)tsbondtbl[(int)uVar21][uVar17] | uVar22);
        *(ulong *)(uVar22 + 0x48 + (ulong)((uint)uVar17 & 1) * 8) =
             (long)stbondtbl[(int)uVar21][uVar17] | (ulong)pppdVar29;
        if ((fc->chkencflag & 2) != 0) {
          uVar21 = *(uint *)(uVar22 + 4 + (long)this->shmarkindex * 4);
          if ((uVar21 & 4) == 0) {
            pmVar4 = this->badsubfacs;
            *(uint *)(uVar22 + 4 + (long)this->shmarkindex * 4) = uVar21 | 4;
            puVar14 = (ulong *)memorypool::alloc(pmVar4);
            *puVar14 = uVar22;
            *(uint *)(puVar14 + 1) = (uint)uVar17;
          }
        }
      }
    }
    uVar21 = enexttbl[fliptets->ver];
    uVar17 = (ulong)uVar21;
    fliptets->ver = uVar21;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_110.ver = (int)uVar25;
  local_110.tet = pppdVar29;
  if ((*(long *)(local_c8 + 0x48) != 0) &&
     (uVar17 = *(ulong *)(*(long *)(local_c8 + 0x48) + local_d0 * 8), uVar17 != 0)) {
    uVar22 = uVar17 & 0xfffffffffffffff8;
    uVar17 = (long)tspivottbl[0][(long)local_f8 * 2 + (ulong)((uint)uVar17 & 7)] ^ 1;
    ppdVar12 = fliptets->tet[9];
    if (ppdVar12 == (tetrahedron)0x0) {
      ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      fliptets->tet[9] = ppdVar12;
      lVar10 = 0;
      do {
        fliptets->tet[9][lVar10] = (double *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ppdVar12 = fliptets->tet[9];
      uVar21 = fliptets->ver;
    }
    ppdVar12[uVar21 & 3] = (double *)((long)tsbondtbl[(int)uVar21][uVar17] | uVar22);
    *(ulong *)(uVar22 + 0x48 + (ulong)((uint)uVar17 & 1) * 8) =
         (long)stbondtbl[(int)uVar21][uVar17] | (ulong)fliptets->tet;
    if ((fc->chkencflag & 2) != 0) {
      uVar21 = *(uint *)(uVar22 + 4 + (long)this->shmarkindex * 4);
      if ((uVar21 & 4) == 0) {
        pmVar4 = this->badsubfacs;
        *(uint *)(uVar22 + 4 + (long)this->shmarkindex * 4) = uVar21 | 4;
        puVar14 = (ulong *)memorypool::alloc(pmVar4);
        *puVar14 = uVar22;
        *(uint *)(puVar14 + 1) = (uint)uVar17;
      }
    }
  }
  p2_00 = local_e8;
  if ((int)local_ec < 0) goto LAB_0012010e;
  lVar10 = 8;
  do {
    *(int *)((long)&local_78[0].sh + lVar10) =
         snextpivot[snextpivot[*(int *)((long)&local_78[0].sh + lVar10)]];
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x38);
  lVar10 = 0;
  flip31(this,local_78,0);
  do {
    pmVar4 = this->subfaces;
    puVar7 = *(undefined8 **)((long)&local_78[0].sh + lVar10);
    puVar7[3] = 0;
    *puVar7 = pmVar4->deaditemstack;
    pmVar4->deaditemstack = puVar7;
    pmVar4->items = pmVar4->items + -1;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x30);
  if ((int)local_ec < 3) {
    uVar22 = (ulong)local_ec;
    uVar17 = local_b0[uVar22 * 2 + -1];
    lVar10 = *(long *)(uVar17 + 0x48);
    if (lVar10 == 0) {
      pvVar15 = memorypool::alloc(this->tet2subpool);
      *(void **)(uVar17 + 0x48) = pvVar15;
      lVar10 = 0;
      do {
        *(undefined8 *)(*(long *)(uVar17 + 0x48) + lVar10 * 8) = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar10 = *(long *)(uVar17 + 0x48);
    }
    uVar21 = (uint)local_b0[uVar22 * 2];
    uVar22 = (ulong)((uVar21 & 3) << 3);
    *(ulong *)(lVar10 + uVar22) = (long)tsbondtbl[(int)uVar21][(int)local_40] | local_48;
    *(ulong *)(local_48 + 0x48 + (ulong)(local_40 & 1) * 8) =
         (long)stbondtbl[(int)uVar21][(int)local_40] | uVar17;
    uVar17 = *(ulong *)(uVar17 + uVar22);
    pppdVar29 = (tetrahedron *)(uVar17 & 0xfffffffffffffff0);
    uVar21 = fsymtbl[(int)uVar21][(uint)uVar17 & 0xf];
    uVar23 = local_40 ^ 1;
    ppdVar12 = pppdVar29[9];
    local_110.tet = pppdVar29;
    local_110.ver = uVar21;
    if (ppdVar12 == (tetrahedron)0x0) {
      ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar29[9] = ppdVar12;
      lVar10 = 0;
      do {
        pppdVar29[9][lVar10] = (double *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
LAB_001200b8:
      ppdVar12 = pppdVar29[9];
    }
  }
  else {
    ppdVar12 = fliptets->tet[9];
    if (ppdVar12 == (tetrahedron)0x0) {
      ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      fliptets->tet[9] = ppdVar12;
      lVar10 = 0;
      do {
        fliptets->tet[9][lVar10] = (double *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ppdVar12 = fliptets->tet[9];
    }
    uVar21 = fliptets->ver;
    uVar17 = (ulong)((uVar21 & 3) << 3);
    *(ulong *)((long)ppdVar12 + uVar17) = (long)tsbondtbl[(int)uVar21][(int)local_40] | local_48;
    *(ulong *)(local_48 + 0x48 + (ulong)(local_40 & 1) * 8) =
         (long)stbondtbl[(int)uVar21][(int)local_40] | (ulong)fliptets->tet;
    uVar17 = *(ulong *)((long)fliptets->tet + uVar17);
    pppdVar29 = (tetrahedron *)(uVar17 & 0xfffffffffffffff0);
    uVar21 = fsymtbl[(int)uVar21][(uint)uVar17 & 0xf];
    uVar23 = local_40 ^ 1;
    ppdVar12 = pppdVar29[9];
    local_110.tet = pppdVar29;
    local_110.ver = uVar21;
    if (ppdVar12 == (tetrahedron)0x0) {
      ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar29[9] = ppdVar12;
      lVar10 = 0;
      do {
        pppdVar29[9][lVar10] = (double *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      goto LAB_001200b8;
    }
  }
  ppdVar12[uVar21 & 3] = (double *)((long)tsbondtbl[(int)uVar21][(int)uVar23] | local_48);
  *(ulong *)(local_48 + 0x48 + (ulong)(uVar23 & 1) * 8) =
       (long)stbondtbl[(int)uVar21][(int)uVar23] | (ulong)pppdVar29;
  p2_00 = local_e8;
LAB_0012010e:
  if ((fc->chkencflag & 4) != 0) {
    enqueuetetrahedron(this,fliptets);
  }
  ptVar8 = (tetgenio *)fliptets->tet;
  iVar16 = this->point2simindex;
  (&local_100->in)[iVar16] = ptVar8;
  (&p2_00->in)[iVar16] = ptVar8;
  ptVar8 = (tetgenio *)fliptets->tet;
  (&p2->in)[iVar16] = ptVar8;
  (&p3->in)[iVar16] = ptVar8;
  if (fc->enqflag < 1) {
    iVar16 = fliptets->ver;
  }
  else {
    flippush(this,&this->flipstack,fliptets);
    iVar16 = fliptets->ver;
    if (1 < fc->enqflag) {
      iVar18 = 3;
      do {
        local_110.tet = fliptets->tet;
        local_110.ver = esymtbl[iVar16];
        flippush(this,&this->flipstack,&local_110);
        iVar16 = enexttbl[fliptets->ver];
        fliptets->ver = iVar16;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
  }
  (this->recenttet).tet = fliptets->tet;
  (this->recenttet).ver = iVar16;
  return;
}

Assistant:

void tetgenmesh::flip41(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastet;
  triface newface, neightet;
  face flipshs[4];
  point pa, pb, pc, pd, pp;
  int dummyflag = 0; // in {0, 1, 2, 3, 4}
  int spivot = -1, scount = 0;
  int t1ver; 
  int i;

  pa =  org(fliptets[3]);
  pb = dest(fliptets[3]);
  pc = apex(fliptets[3]);
  pd = dest(fliptets[0]);
  pp =  org(fliptets[0]); // The removing vertex.

  flip41count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    enext(fliptets[i], topcastets[i]);
    fnextself(topcastets[i]); // [d,a,b,#], [d,b,c,#], [d,c,a,#]
    enextself(topcastets[i]); // [a,b,d,#], [b,c,d,#], [c,a,d,#]
  }
  fsym(fliptets[3], botcastet); // [b,a,c,#]

  if (checksubfaceflag) {
    // Check if there are three subfaces at 'p'.
    //   Re-use 'newface'.
    for (i = 0; i < 3; i++) {
      fnext(fliptets[3], newface); // [a,b,p,d],[b,c,p,d],[c,a,p,d].
      tspivot(newface, flipshs[i]);
      if (flipshs[i].sh != NULL) {
        spivot = i; // Remember this subface.
        scount++;
      }
      enextself(fliptets[3]);
    }
    if (scount > 0) {
      // There are three subfaces connecting at p.
      if (scount < 3) {
        // The new subface is one of {[a,b,d], [b,c,d], [c,a,d]}.
        // Go to the tet containing the three subfaces.
        fsym(topcastets[spivot], neightet);
        // Get the three subfaces connecting at p.
        for (i = 0; i < 3; i++) {
          esym(neightet, newface);
          tspivot(newface, flipshs[i]);
          eprevself(neightet);
        }
      } else {
        spivot = 3; // The new subface is [a,b,c].
      }
    }
  } // if (checksubfaceflag)


  // Re-use fliptets[0] for [a,b,c,d].
  fliptets[0].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clean all flags.
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
  }
  // Delete the other three tets.
  for (i = 1; i < 4; i++) {
    tetrahedrondealloc(fliptets[i].tet);
  }

  if (pp != dummypoint) {
    // Mark the point pp as unused.
    setpointtype(pp, UNUSEDVERTEX);
    unuverts++;
  }

  // Create the new tet [a,b,c,d].
  if (hullflag > 0) {
    // One of the five vertices may be 'dummypoint'.
    if (pa == dummypoint) {
      // pa is dummypoint.
      setvertices(fliptets[0], pc, pb, pd, pa);
      esymself(fliptets[0]);  // [b,c,a,d]
      eprevself(fliptets[0]); // [a,b,c,d]
      dummyflag = 1;
    } else if (pb == dummypoint) {
      setvertices(fliptets[0], pa, pc, pd, pb);
      esymself(fliptets[0]);  // [c,a,b,d]
      enextself(fliptets[0]); // [a,b,c,d]
      dummyflag = 2;
    } else if (pc == dummypoint) {
      setvertices(fliptets[0], pb, pa, pd, pc);
      esymself(fliptets[0]);  // [a,b,c,d]
      dummyflag = 3;
    } else if (pd == dummypoint) {
      setvertices(fliptets[0], pa, pb, pc, pd);
      dummyflag = 4;
    } else {
      setvertices(fliptets[0], pa, pb, pc, pd);
      if (pp == dummypoint) {
        dummyflag = -1;
      } else {
        dummyflag = 0;
      }
    }
    if (dummyflag > 0) {
      // We deleted 3 hull tets, and create 1 hull tet.
      hullsize -= 2;
    } else if (dummyflag < 0) {
      // We deleted 4 hull tets.
      hullsize -= 4;
      // meshedges does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[4], volpos[1], vol_diff;
    if (dummyflag > 0) {
      if (pa == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = tetprismvol(pp, pd, pb, pc);
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else if (pb == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = tetprismvol(pp, pd, pc, pa);
        volneg[3] = 0.;
      } else if (pc == dummypoint) {
        volneg[0] = tetprismvol(pp, pd, pa, pb);
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = tetprismvol(pa, pb, pc, pp);
      }
      volpos[0] = 0.;
    } else if (dummyflag < 0) {
      volneg[0] = 0.;
      volneg[1] = 0.;
      volneg[2] = 0.;
      volneg[3] = 0.;
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    } else {
      volneg[0] = tetprismvol(pp, pd, pa, pb);
      volneg[1] = tetprismvol(pp, pd, pb, pc);
      volneg[2] = tetprismvol(pp, pd, pc, pa);
      volneg[3] = tetprismvol(pa, pb, pc, pp);
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    }
    vol_diff = volpos[0] - volneg[0] - volneg[1] - volneg[2] - volneg[3];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond the new tet to adjacent tets.
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface); // At faces [b,a,d], [c,b,d], [a,c,d].
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  bond(fliptets[0], botcastet);

  if (checksubsegflag) {
    face checkseg;
    // Bond 6 segments (at edges of [a,b,c,d]) if there there are.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], newface); // At edges [d,a],[d,b],[d,c].
      if (issubseg(newface)) {
        tsspivot1(newface, checkseg);
        esym(fliptets[0], newface);
        enextself(newface); // At edges [a,d], [b,d], [c,d].
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    for (i = 0; i < 3; i++) {
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg); // At edges [a,b],[b,c],[c,a].
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
  }

  if (checksubfaceflag) {
    face checksh;
    // Bond 4 subfaces (at faces of [a,b,c,d]) if there are.
    for (i = 0; i < 3; i++) {
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh); // At faces [a,b,d],[b,c,d],[c,a,d]
        esym(fliptets[0], newface); // At faces [b,a,d],[c,b,d],[a,c,d]
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    if (issubface(botcastet)) {
      tspivot(botcastet, checksh); // At face [b,a,c]
      sesymself(checksh);
      tsbond(fliptets[0], checksh);
      if (fc->chkencflag & 2) {
        enqueuesubface(badsubfacs, &checksh);
      }
    }

    if (spivot >= 0) {
      // Perform a 3-to-1 flip in surface triangulation.
      // Depending on the value of 'spivot', the three subfaces are:
      //   - 0: [a,b,p], [b,d,p], [d,a,p]
      //   - 1: [b,c,p], [c,d,p], [d,b,p] 
      //   - 2: [c,a,p], [a,d,p], [d,c,p] 
      //   - 3: [a,b,p], [b,c,p], [c,a,p]
      // Adjust the three subfaces such that their origins are p, i.e., 
      //   - 3: [p,a,b], [p,b,c], [p,c,a]. (Required by the flip31()).
      for (i = 0; i < 3; i++) {
        senext2self(flipshs[i]);
      }
      flip31(flipshs, 0);
      // Delete the three old subfaces.
      for (i = 0; i < 3; i++) {
        shellfacedealloc(subfaces, flipshs[i].sh);
      }
      if (spivot < 3) {
        // // Bond the new subface to the new tet [a,b,c,d].
        tsbond(topcastets[spivot], flipshs[3]);
        fsym(topcastets[spivot], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      } else {
        // Bound the new subface [a,b,c] to the new tet [a,b,c,d].
        tsbond(fliptets[0], flipshs[3]);
        fsym(fliptets[0], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      }
    } // if (spivot > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    enqueuetetrahedron(&(fliptets[0]));
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    flippush(flipstack, &(fliptets[0])); // [a,b,c] (opposite to new point).
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        esym(fliptets[0], newface);
        flippush(flipstack, &newface);
        enextself(fliptets[0]);
      }
    }
  }

  recenttet = fliptets[0];
}